

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall
bloaty::RollupOutput::PrintTreeToCSV
          (RollupOutput *this,RollupRow *row,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parent_labels,ostream *out,bool tabs,bool csvDiff)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  RollupRow *pRVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  undefined7 in_register_00000081;
  const_iterator __begin2;
  RollupRow *row_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  RollupOutput *local_78;
  ostream *local_70;
  RollupRow *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_78 = this;
  local_70 = out;
  if ((int)CONCAT71(in_register_00000081,tabs) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(parent_labels,&row->name);
    goto LAB_001875e5;
  }
  pcVar2 = (row->name)._M_dataplus._M_p;
  sVar3 = (row->name)._M_string_length;
  if (sVar3 == 0) {
LAB_0018759c:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar2,pcVar2 + sVar3);
  }
  else {
    sVar5 = 0;
    bVar7 = false;
    do {
      cVar1 = pcVar2[sVar5];
      bVar6 = true;
      if ((cVar1 != '\"') && (cVar1 != ',')) {
        bVar6 = bVar7;
      }
    } while (((cVar1 != '\"') && (cVar1 != ',')) &&
            (sVar5 = sVar5 + 1, bVar7 = bVar6, sVar3 != sVar5));
    if (!bVar6) goto LAB_0018759c;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98.field_2._M_allocated_capacity._0_2_ = 0x22;
    local_98._M_string_length = 1;
    sVar5 = 0;
    local_68 = row;
    do {
      if (pcVar2[sVar5] == '\"') {
        std::__cxx11::string::append((char *)&local_98);
      }
      else {
        std::__cxx11::string::push_back((char)&local_98);
      }
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
    std::__cxx11::string::append((char *)&local_98);
    row = local_68;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
             &local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT62(local_98.field_2._M_allocated_capacity._2_6_,
                             local_98.field_2._M_allocated_capacity._0_2_) + 1);
  }
LAB_001875e5:
  row_00 = (row->sorted_children).
           super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar4 = (row->sorted_children).
           super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar4 == row_00) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,parent_labels);
    PrintRowToCSV(local_78,row,&local_60,local_70,tabs,csvDiff);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
  }
  else {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,parent_labels);
      PrintTreeToCSV(local_78,row_00,&local_48,local_70,tabs,csvDiff);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      row_00 = row_00 + 1;
    } while (row_00 != pRVar4);
  }
  return;
}

Assistant:

void RollupOutput::PrintTreeToCSV(const RollupRow& row,
                                  std::vector<std::string> parent_labels,
                                  std::ostream* out, bool tabs, bool csvDiff) const {
  if (tabs) {
    parent_labels.push_back(row.name);
  } else {
    parent_labels.push_back(CSVEscape(row.name));
  }

  if (row.sorted_children.size() > 0) {
    for (const auto& child_row : row.sorted_children) {
      PrintTreeToCSV(child_row, parent_labels, out, tabs, csvDiff);
    }
  } else {
    PrintRowToCSV(row, parent_labels, out, tabs, csvDiff);
  }
}